

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode,
          bool build_it)

{
  pointer pcVar1;
  bool build_it_00;
  long lVar2;
  string *psVar3;
  undefined8 uVar4;
  undefined7 in_register_00000081;
  Type TVar6;
  Symbol SVar7;
  string scope_to_try;
  string first_part_of_name;
  string local_90;
  undefined4 local_6c;
  string local_68;
  string *local_48;
  ResolveMode local_3c;
  string *local_38;
  anon_union_8_8_13f84498_for_Symbol_2 aVar5;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  (this->undefine_resolved_name_)._M_string_length = 0;
  *(this->undefine_resolved_name_)._M_dataplus._M_p = '\0';
  local_3c = resolve_mode;
  if ((name->_M_string_length == 0) || (*(name->_M_dataplus)._M_p != '.')) {
    lVar2 = std::__cxx11::string::find((char)name,0x2e);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    if (lVar2 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_68);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)name);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    local_6c = (undefined4)CONCAT71(in_register_00000081,build_it);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar1 = (relative_to->_M_dataplus)._M_p;
    local_48 = name;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + relative_to->_M_string_length);
    psVar3 = (string *)std::__cxx11::string::rfind((char)&local_90,0x2e);
    if (psVar3 != (string *)0xffffffffffffffff) {
      local_38 = (string *)&this->undefine_resolved_name_;
      build_it_00 = local_6c._0_1_;
      do {
        if (local_90._M_string_length < psVar3) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     psVar3);
LAB_00571a52:
          uVar4 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase",relative_to);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,
                            CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                     local_68.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar4);
        }
        local_90._M_dataplus._M_p[(long)psVar3] = '\0';
        local_90._M_string_length = (size_type)psVar3;
        std::__cxx11::string::_M_replace_aux((ulong)&local_90,(ulong)psVar3,0,'\x01');
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_68._M_dataplus._M_p);
        SVar7 = FindSymbol(this,&local_90,build_it_00);
        aVar5 = SVar7.field_1;
        TVar6 = SVar7.type;
        if (TVar6 != NULL_SYMBOL) {
          if (local_68._M_string_length < local_48->_M_string_length) {
            if ((TVar6 < (PACKAGE|MESSAGE)) && ((0x152U >> (TVar6 & 0x1f) & 1) != 0)) {
              std::__cxx11::string::append
                        ((string *)&local_90,(ulong)local_48,local_68._M_string_length);
              SVar7 = FindSymbol(this,&local_90,build_it_00);
              aVar5 = SVar7.field_1;
              TVar6 = SVar7.type;
              if (TVar6 == NULL_SYMBOL) {
                TVar6 = NULL_SYMBOL;
                std::__cxx11::string::_M_assign(local_38);
              }
              goto LAB_005719ed;
            }
          }
          else if (((local_3c != LOOKUP_TYPES) || (TVar6 == MESSAGE)) || (TVar6 == ENUM))
          goto LAB_005719ed;
        }
        relative_to = psVar3;
        if (local_90._M_string_length < psVar3) goto LAB_00571a52;
        local_90._M_dataplus._M_p[(long)psVar3] = '\0';
        local_90._M_string_length = (size_type)psVar3;
        psVar3 = (string *)std::__cxx11::string::rfind((char)&local_90,0x2e);
      } while (psVar3 != (string *)0xffffffffffffffff);
    }
    SVar7 = FindSymbol(this,local_48,local_6c._0_1_);
    aVar5 = SVar7.field_1;
    TVar6 = SVar7.type;
LAB_005719ed:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)name);
    SVar7 = FindSymbol(this,&local_68,build_it);
    aVar5 = SVar7.field_1;
    TVar6 = SVar7.type;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  SVar7._4_4_ = 0;
  SVar7.type = TVar6;
  SVar7.field_1.descriptor = aVar5.descriptor;
  return SVar7;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(const string& name,
                                                    const string& relative_to,
                                                    ResolveMode resolve_mode,
                                                    bool build_it) {
  possible_undeclared_dependency_ = NULL;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  string::size_type name_dot_pos = name.find_first_of('.');
  string first_part_of_name;
  if (name_dot_pos == string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}